

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineState.h
# Opt level: O3

bool Diligent::PipelineResourceLayoutDesc::IsEqual
               (PipelineResourceLayoutDesc *Desc1,PipelineResourceLayoutDesc *Desc2,
               bool IgnoreVariables,bool IgnoreSamplers)

{
  bool bVar1;
  Uint32 UVar2;
  ulong uVar3;
  long lVar4;
  
  if (Desc1->DefaultVariableType != Desc2->DefaultVariableType) {
    return false;
  }
  if (((Desc1->DefaultVariableMergeStages == Desc2->DefaultVariableMergeStages) &&
      (Desc1->NumVariables == Desc2->NumVariables)) &&
     (UVar2 = Desc1->NumImmutableSamplers, UVar2 == Desc2->NumImmutableSamplers)) {
    if (Desc1->NumVariables != 0 && !IgnoreVariables) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        bVar1 = ShaderResourceVariableDesc::operator==
                          ((ShaderResourceVariableDesc *)((long)&Desc1->Variables->Name + lVar4),
                           (ShaderResourceVariableDesc *)((long)&Desc2->Variables->Name + lVar4));
        if (!bVar1) goto LAB_00348eef;
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x10;
      } while (uVar3 < Desc1->NumVariables);
      UVar2 = Desc1->NumImmutableSamplers;
    }
    bVar1 = true;
    if ((!IgnoreSamplers) && (UVar2 != 0)) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        bVar1 = ImmutableSamplerDesc::operator==
                          ((ImmutableSamplerDesc *)
                           ((long)(Desc1->ImmutableSamplers->Desc).BorderColor + lVar4 + -0x2c),
                           (ImmutableSamplerDesc *)
                           ((long)(Desc2->ImmutableSamplers->Desc).BorderColor + lVar4 + -0x2c));
        if (!bVar1) {
          return bVar1;
        }
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x48;
      } while (uVar3 < Desc1->NumImmutableSamplers);
    }
  }
  else {
LAB_00348eef:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool IsEqual(const PipelineResourceLayoutDesc& Desc1,
                        const PipelineResourceLayoutDesc& Desc2,
                        bool                              IgnoreVariables = false,
                        bool                              IgnoreSamplers  = false)
    {
        if (!(Desc1.DefaultVariableType        == Desc2.DefaultVariableType        &&
              Desc1.DefaultVariableMergeStages == Desc2.DefaultVariableMergeStages &&
              Desc1.NumVariables               == Desc2.NumVariables               &&
              Desc1.NumImmutableSamplers       == Desc2.NumImmutableSamplers))
           return false;

        if (!IgnoreVariables)
        {
            for (Uint32 i = 0; i < Desc1.NumVariables; ++i)
                if (Desc1.Variables[i] != Desc2.Variables[i])
                    return false;
        }

        if (!IgnoreSamplers)
        {
            for (Uint32 i = 0; i < Desc1.NumImmutableSamplers; ++i)
                if (Desc1.ImmutableSamplers[i] != Desc2.ImmutableSamplers[i])
                    return false;
        }

        return true;
    }